

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

TermSpec __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::deref
          (InstMatcher *this,TermList var)

{
  bool bVar1;
  undefined7 extraout_var;
  ulong uVar2;
  TermSpec TVar3;
  TermSpec res;
  TermList local_30;
  TermSpec local_28;
  
  local_30._content = var._content;
  while( true ) {
    local_28.q = false;
    local_28.t._content = 2;
    bVar1 = Lib::
            DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::find(&this->_bindings,&local_30,&local_28);
    if (!bVar1) break;
    uVar2 = CONCAT71(extraout_var,local_28.q);
    if (((local_28.t._content & 3) == 0) ||
       (((uint)local_28.t._content & 3) == 1 && (local_28.q & 1U) == 0)) goto LAB_002bb835;
    local_30._content = local_28.t._content;
  }
  uVar2 = (ulong)(((uint)local_30._content & 3) == 1);
  local_28.t._content = local_30._content;
LAB_002bb835:
  TVar3.t._content = local_28.t._content;
  TVar3._0_8_ = uVar2;
  return TVar3;
}

Assistant:

typename SubstitutionTree<LeafData_>::InstMatcher::TermSpec SubstitutionTree<LeafData_>::InstMatcher::deref(TermList var)
{
  ASS_REP(var.isVar(), var.tag());

#if VDEBUG
  int ctr=0;
#endif
  for(;;) {
    TermSpec res;
    if(!_bindings.find(var, res)) {
	return TermSpec(var.isOrdinaryVar() ? true : false, var);
    }
    if( res.t.isTerm() || (!res.q && res.t.isOrdinaryVar()) ) {
	return res;
    }
    ASS(!res.q || !res.t.isSpecialVar());
    var=res.t;
#if VDEBUG
    ctr++;
    ASS_L(ctr,1000000); //assert that there are no cycles
#endif
  }
}